

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

void ixmlNode_getElementsByTagNameNS
               (IXML_Node *n,char *namespaceURI,char *localName,IXML_NodeList **list)

{
  unsigned_short uVar1;
  int iVar2;
  char *__s1;
  char *__s2;
  IXML_Node *n_00;
  char *name;
  char *nsURI;
  IXML_NodeList **list_local;
  char *localName_local;
  char *namespaceURI_local;
  IXML_Node *n_local;
  
  if (((n != (IXML_Node *)0x0) && (namespaceURI != (char *)0x0)) && (localName != (char *)0x0)) {
    uVar1 = ixmlNode_getNodeType(n);
    if (uVar1 == 1) {
      __s1 = ixmlNode_getLocalName(n);
      __s2 = ixmlNode_getNamespaceURI(n);
      if ((((__s1 != (char *)0x0) && (__s2 != (char *)0x0)) &&
          ((iVar2 = strcmp(namespaceURI,__s2), iVar2 == 0 ||
           (iVar2 = strcmp(namespaceURI,"*"), iVar2 == 0)))) &&
         ((iVar2 = strcmp(__s1,localName), iVar2 == 0 || (iVar2 = strcmp(localName,"*"), iVar2 == 0)
          ))) {
        ixmlNodeList_addToNodeList(list,n);
      }
    }
    n_00 = ixmlNode_getFirstChild(n);
    ixmlNode_getElementsByTagNameNSRecursive(n_00,namespaceURI,localName,list);
    return;
  }
  __assert_fail("n != NULL && namespaceURI != NULL && localName != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/node.c",
                0x53b,
                "void ixmlNode_getElementsByTagNameNS(IXML_Node *, const char *, const char *, IXML_NodeList **)"
               );
}

Assistant:

void ixmlNode_getElementsByTagNameNS(IXML_Node *n,
	const char *namespaceURI,
	const char *localName,
	IXML_NodeList **list)
{
	const DOMString nsURI;
	const DOMString name;

	assert(n != NULL && namespaceURI != NULL && localName != NULL);

	if (ixmlNode_getNodeType(n) == eELEMENT_NODE) {
		name = ixmlNode_getLocalName(n);
		nsURI = ixmlNode_getNamespaceURI(n);
		if (name != NULL && nsURI != NULL &&
			(strcmp(namespaceURI, nsURI) == 0 ||
				strcmp(namespaceURI, "*") == 0) &&
			(strcmp(name, localName) == 0 ||
				strcmp(localName, "*") == 0)) {
			ixmlNodeList_addToNodeList(list, n);
		}
	}

	ixmlNode_getElementsByTagNameNSRecursive(
		ixmlNode_getFirstChild(n), namespaceURI, localName, list);
}